

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLRSA.cpp
# Opt level: O0

bool __thiscall OSSLRSA::verifyUpdate(OSSLRSA *this,ByteString *originalData)

{
  bool bVar1;
  uint uVar2;
  ulong uVar3;
  ByteString *in_RSI;
  AsymmetricAlgorithm *in_RDI;
  ByteString dummy_1;
  ByteString dummy;
  ByteString local_78;
  ByteString local_40;
  ByteString *local_18;
  byte local_1;
  
  local_18 = in_RSI;
  bVar1 = AsymmetricAlgorithm::verifyUpdate(in_RDI,in_RSI);
  if (bVar1) {
    uVar3 = (**(code **)(*in_RDI[1]._vptr_AsymmetricAlgorithm + 0x18))
                      (in_RDI[1]._vptr_AsymmetricAlgorithm,local_18);
    if ((uVar3 & 1) == 0) {
      if (in_RDI[1]._vptr_AsymmetricAlgorithm != (_func_int **)0x0) {
        (**(code **)(*in_RDI[1]._vptr_AsymmetricAlgorithm + 8))();
      }
      in_RDI[1]._vptr_AsymmetricAlgorithm = (_func_int **)0x0;
      ByteString::ByteString((ByteString *)0x1c0b1c);
      AsymmetricAlgorithm::verifyFinal(in_RDI,&local_40);
      local_1 = 0;
      ByteString::~ByteString((ByteString *)0x1c0b3f);
    }
    else {
      if (in_RDI[1].currentPublicKey != (PublicKey *)0x0) {
        uVar2 = (*((in_RDI[1].currentPublicKey)->super_Serialisable)._vptr_Serialisable[3])
                          (in_RDI[1].currentPublicKey,local_18);
        if ((uVar2 & 1) == 0) {
          if (in_RDI[1]._vptr_AsymmetricAlgorithm != (_func_int **)0x0) {
            (**(code **)(*in_RDI[1]._vptr_AsymmetricAlgorithm + 8))();
          }
          in_RDI[1]._vptr_AsymmetricAlgorithm = (_func_int **)0x0;
          if (in_RDI[1].currentPublicKey != (PublicKey *)0x0) {
            (*((in_RDI[1].currentPublicKey)->super_Serialisable)._vptr_Serialisable[1])();
          }
          in_RDI[1].currentPublicKey = (PublicKey *)0x0;
          ByteString::ByteString((ByteString *)0x1c0bf1);
          AsymmetricAlgorithm::verifyFinal(in_RDI,&local_78);
          local_1 = 0;
          ByteString::~ByteString((ByteString *)0x1c0c13);
          goto LAB_001c0c37;
        }
      }
      local_1 = 1;
    }
  }
  else {
    local_1 = 0;
  }
LAB_001c0c37:
  return (bool)(local_1 & 1);
}

Assistant:

bool OSSLRSA::verifyUpdate(const ByteString& originalData)
{
	if (!AsymmetricAlgorithm::verifyUpdate(originalData))
	{
		return false;
	}

	if (!pCurrentHash->hashUpdate(originalData))
	{
		delete pCurrentHash;
		pCurrentHash = NULL;

		ByteString dummy;
		AsymmetricAlgorithm::verifyFinal(dummy);

		return false;
	}

	if ((pSecondHash != NULL) && !pSecondHash->hashUpdate(originalData))
	{
		delete pCurrentHash;
		pCurrentHash = NULL;

		delete pSecondHash;
		pSecondHash = NULL;

		ByteString dummy;
		AsymmetricAlgorithm::verifyFinal(dummy);

		return false;
	}

	return true;
}